

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

value object_get(object obj,char *key)

{
  attribute paVar1;
  attribute in_RSI;
  undefined8 *in_RDI;
  value v;
  attribute attr;
  accessor_type accessor;
  klass in_stack_ffffffffffffffa8;
  undefined4 local_28 [2];
  attribute local_20;
  attribute local_18;
  undefined8 *local_10;
  value local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 8) == 0)) {
    local_8 = (value)0x0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    paVar1 = class_attribute(in_stack_ffffffffffffffa8,(char *)0x10b7d1);
    if (paVar1 == (attribute)0x0) {
      if (*(int *)(local_10 + 1) == 0) {
        log_write_impl_va("metacall",0x100,"object_get",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                          ,3,"Attribute %s in object %s is not defined",local_18,*local_10);
        return (value)0x0;
      }
      if (*(int *)(local_10 + 1) == 1) {
        local_20 = local_18;
      }
      local_28[0] = 1;
    }
    else {
      local_28[0] = 0;
      local_20 = paVar1;
    }
    local_8 = (value)(**(code **)(local_10[3] + 8))(local_10,local_10[2],local_28);
    if (local_8 == (value)0x0) {
      log_write_impl_va("metacall",0x115,"object_get",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,3,"Invalid object %s get of attribute %s",*local_10,local_18);
    }
  }
  return local_8;
}

Assistant:

value object_get(object obj, const char *key)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->get != NULL)
	{
		struct accessor_type accessor;
		attribute attr = class_attribute(obj->cls, key);

		if (attr == NULL)
		{
			switch (obj->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Attribute %s in object %s is not defined", key, obj->name);
					return NULL;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		value v = obj->interface->get(obj, obj->impl, &accessor);

		if (v == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object %s get of attribute %s", obj->name, key);
		}

		return v;
	}

	return NULL;
}